

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void flatbuffers::tests::EnumStringsTest(void)

{
  bool bVar1;
  IDLOptions local_1fc8;
  undefined1 local_1cb8 [8];
  Parser parser3;
  undefined1 local_1228 [8];
  Parser parser2;
  IDLOptions local_a98;
  undefined1 local_788 [8];
  Parser parser1;
  
  IDLOptions::IDLOptions(&local_a98);
  Parser::Parser((Parser *)local_788,&local_a98);
  IDLOptions::~IDLOptions(&local_a98);
  bVar1 = Parser::Parse((Parser *)local_788,
                        "enum E:byte { A, B, C } table T { F:[E]; }root_type T;{ F:[ A, B, \"C\", \"A B C\" ] }"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser1.Parse(\"enum E:byte { A, B, C } table T { F:[E]; }\" \"root_type T;\" \"{ F:[ A, B, \\\"C\\\", \\\"A B C\\\" ] }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x22a,"");
  IDLOptions::IDLOptions((IDLOptions *)&parser3.anonymous_counter_);
  Parser::Parser((Parser *)local_1228,(IDLOptions *)&parser3.anonymous_counter_);
  IDLOptions::~IDLOptions((IDLOptions *)&parser3.anonymous_counter_);
  bVar1 = Parser::Parse((Parser *)local_1228,
                        "enum E:byte { A, B, C } table T { F:[int]; }root_type T;{ F:[ \"E.C\", \"E.A E.B E.C\" ] }"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser2.Parse(\"enum E:byte { A, B, C } table T { F:[int]; }\" \"root_type T;\" \"{ F:[ \\\"E.C\\\", \\\"E.A E.B E.C\\\" ] }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x22f,"");
  IDLOptions::IDLOptions(&local_1fc8);
  Parser::Parser((Parser *)local_1cb8,&local_1fc8);
  IDLOptions::~IDLOptions(&local_1fc8);
  bVar1 = Parser::Parse((Parser *)local_1cb8,
                        "enum E:uint16 (bit_flags) { F0, F07=7, F08, F14=14, F15 } table T { F: E = \"F15 F08\"; }root_type T;"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser3.Parse(\"enum E:uint16 (bit_flags) { F0, F07=7, F08, F14=14, F15 }\" \" table T { F: E = \\\"F15 F08\\\"; }\" \"root_type T;\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x236,"");
  Parser::~Parser((Parser *)local_1cb8);
  Parser::~Parser((Parser *)local_1228);
  Parser::~Parser((Parser *)local_788);
  return;
}

Assistant:

void EnumStringsTest() {
  flatbuffers::Parser parser1;
  TEST_EQ(parser1.Parse("enum E:byte { A, B, C } table T { F:[E]; }"
                        "root_type T;"
                        "{ F:[ A, B, \"C\", \"A B C\" ] }"),
          true);
  flatbuffers::Parser parser2;
  TEST_EQ(parser2.Parse("enum E:byte { A, B, C } table T { F:[int]; }"
                        "root_type T;"
                        "{ F:[ \"E.C\", \"E.A E.B E.C\" ] }"),
          true);
  // unsigned bit_flags
  flatbuffers::Parser parser3;
  TEST_EQ(
      parser3.Parse("enum E:uint16 (bit_flags) { F0, F07=7, F08, F14=14, F15 }"
                    " table T { F: E = \"F15 F08\"; }"
                    "root_type T;"),
      true);
}